

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O2

void test_case_signed_sub(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_signed_sub(struct zt_unit_test *test, void *data UNUSED)
{
    /* subtraction overflow */

    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MAX, 1) == CHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_char_sub(1, CHAR_MAX) == 1 - CHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MIN, -1) == CHAR_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_char_sub(-1, CHAR_MIN) == -1 - CHAR_MIN);
    ZT_UNIT_ASSERT(test, zt_char_sub(CHAR_MAX / 2, 1) == (CHAR_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_char_sub(1, CHAR_MAX / 2) == 1 - (CHAR_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_sub(CHAR_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_sub(1, CHAR_MIN)); */

    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MAX, 1) == SHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_short_sub(1, SHORT_MAX) == 1 - SHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MIN, -1) == SHORT_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_short_sub(-1, SHORT_MIN) == -1 - SHORT_MIN);
    ZT_UNIT_ASSERT(test, zt_short_sub(SHORT_MAX / 2, 1) == (SHORT_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_short_sub(1, SHORT_MAX / 2) == 1 - (SHORT_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_sub(SHORT_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_sub(1, SHORT_MIN)); */

    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MAX, 1) == INT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_int_sub(1, INT_MAX) == 1 - INT_MAX);
    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MIN, -1) == INT_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_int_sub(-1, INT_MIN) == -1 - INT_MIN);
    ZT_UNIT_ASSERT(test, zt_int_sub(INT_MAX / 2, 1) == (INT_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_int_sub(1, INT_MAX / 2) == 1 - (INT_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_sub(INT_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_sub(1, INT_MIN)); */

# ifndef __x86_64__
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MAX, 1) == LONG_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_long_sub(1, LONG_MAX) == 1 - LONG_MAX);
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MIN, -1) == LONG_MIN - -1);
    ZT_UNIT_ASSERT(test, zt_long_sub(-1, LONG_MIN) == -1 - LONG_MIN);
    ZT_UNIT_ASSERT(test, zt_long_sub(LONG_MAX / 2, 1) == (LONG_MAX / 2) - 1);
    ZT_UNIT_ASSERT(test, zt_long_sub(1, LONG_MAX / 2) == 1 - (LONG_MAX / 2));

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_sub(LONG_MIN, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_sub(1, LONG_MIN)); */
# endif /* ifndef __x86_64__ */
}